

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  Arg *in_R8;
  string_view data;
  string_view format_00;
  string local_60;
  size_type local_40;
  pointer local_38;
  
  format_00._M_len = format._M_str;
  local_38 = (arg->_M_dataplus)._M_p;
  local_40 = arg->_M_string_length;
  format_00._M_str = (char *)&local_40;
  absl::lts_20250127::Substitute_abi_cxx11_(&local_60,(lts_20250127 *)format._M_len,format_00,in_R8)
  ;
  data._M_str = local_60._M_dataplus._M_p;
  data._M_len = local_60._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }